

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
                  *this,int opcode)

{
  OpCodeInfo *pOVar1;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *this_00;
  NLHandler<mp::NullNLHandler<int>,_int> *in_RDI;
  PairwiseArgHandler args_3;
  int num_args_1;
  LogicalArgHandler args_2;
  int num_args;
  LogicalExpr else_expr;
  LogicalExpr then_expr;
  LogicalExpr condition;
  char c;
  NumericExpr lhs;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::NumericExprReader>
  args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::LogicalExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  undefined8 in_stack_ffffffffffffff58;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  LogicalExpr in_stack_ffffffffffffff6c;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *in_stack_ffffffffffffff70;
  int opcode_00;
  LogicalExpr else_expr_00;
  undefined8 in_stack_ffffffffffffff78;
  CStringRef in_stack_ffffffffffffff90;
  BasicCStringRef<char> local_48;
  char local_39;
  NumericExpr local_38;
  Kind local_24;
  OpCodeInfo *local_20;
  LogicalExpr local_4;
  
  local_20 = GetOpCodeInfo((int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  local_24 = local_20->kind;
  this_00 = (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
             *)(ulong)(local_20->first_kind - NOT);
  switch(this_00) {
  case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x0:
    ReadLogicalExpr(this_00);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnNot
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff6c);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x1:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::LogicalExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::LogicalExprReader>
                       *)in_stack_ffffffffffffff70,
                      (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
                       *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnBinaryLogical
                        (in_RDI,(Kind)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                         (LogicalExpr)in_stack_ffffffffffffff78,
                         (LogicalExpr)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff90,
               "expected logical expression opcode");
    BinaryReaderBase::ReportError<>((BinaryReaderBase *)this_00,in_stack_ffffffffffffff90);
    local_4 = 0;
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x4:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::NumericExprReader>
                       *)in_stack_ffffffffffffff70,
                      (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
                       *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnRelational
                        (in_RDI,(Kind)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                         (NumericExpr)in_stack_ffffffffffffff78,
                         (NumericExpr)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0xa:
    local_38 = ReadNumericExpr(in_stack_ffffffffffffff60,
                               SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
    local_39 = ReaderBase::ReadChar((ReaderBase *)in_RDI->_vptr_NLHandler);
    if (local_39 == 'o') {
      ReadOpCode(in_stack_ffffffffffffff70);
      opcode_00 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      pOVar1 = GetOpCodeInfo(opcode_00);
      if (pOVar1->kind != COUNT) goto LAB_00257e4c;
    }
    else {
LAB_00257e4c:
      opcode_00 = (int)((ulong)in_RDI->_vptr_NLHandler >> 0x20);
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_48,"expected count expression");
      BinaryReaderBase::ReportError<>((BinaryReaderBase *)this_00,in_stack_ffffffffffffff90);
    }
    ReadCountExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
                   *)in_RDI[2]._vptr_NLHandler);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnLogicalCount
                        (in_RDI,(Kind)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                         (NumericExpr)in_stack_ffffffffffffff78,opcode_00);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x10:
    ReadLogicalExpr(this_00);
    else_expr_00 = (LogicalExpr)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    ReadLogicalExpr(this_00);
    ReadLogicalExpr(this_00);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnImplication
                        (in_RDI,(LogicalExpr)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                         (LogicalExpr)in_stack_ffffffffffffff78,else_expr_00);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x11:
    ReadNumArgs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    NLHandler<mp::NullNLHandler<int>,_int>::BeginIteratedLogical
              ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff60,
               (Kind)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               (ArgHandler *)in_stack_ffffffffffffff60);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::EndIteratedLogical
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2]._vptr_NLHandler);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x13:
    ReadNumArgs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    NLHandler<mp::NullNLHandler<int>,_int>::BeginPairwise
              ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff60,
               (Kind)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               (ArgHandler *)in_stack_ffffffffffffff60);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::EndPairwise
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2]._vptr_NLHandler);
  }
  return local_4;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}